

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

void __thiscall cfd::core::Address::CalculateTaproot(Address *this,string *bech32_hrp)

{
  ByteData local_30;
  string *local_18;
  string *bech32_hrp_local;
  Address *this_local;
  
  local_18 = bech32_hrp;
  bech32_hrp_local = (string *)this;
  SchnorrPubkey::GetData(&local_30,&this->schnorr_pubkey_);
  ByteData::operator=(&this->hash_,&local_30);
  ByteData::~ByteData(&local_30);
  CalculateBech32m(this,&this->hash_,local_18);
  return;
}

Assistant:

void Address::CalculateTaproot(const std::string& bech32_hrp) {
  hash_ = schnorr_pubkey_.GetData();
  CalculateBech32m(hash_, bech32_hrp);
}